

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_types.h
# Opt level: O0

char * Potassco::toString(Heuristic_t t)

{
  uint uVar1;
  Heuristic_t local_c;
  char *local_8;
  
  uVar1 = Heuristic_t::operator_cast_to_unsigned_int(&local_c);
  switch(uVar1) {
  case 0:
    local_8 = "level";
    break;
  case 1:
    local_8 = "sign";
    break;
  case 2:
    local_8 = "factor";
    break;
  case 3:
    local_8 = "init";
    break;
  case 4:
    local_8 = "true";
    break;
  case 5:
    local_8 = "false";
    break;
  default:
    local_8 = "";
  }
  return local_8;
}

Assistant:

inline const char* toString(Heuristic_t t) {
	switch (t) {
		case Heuristic_t::Level: return "level";
		case Heuristic_t::Sign:  return "sign";
		case Heuristic_t::Factor:return "factor";
		case Heuristic_t::Init:  return "init";
		case Heuristic_t::True:  return "true";
		case Heuristic_t::False: return "false";
		default: return "";
	}
}